

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O1

void OPN2_PhaseGenerate(ym3438_t *chip)

{
  Bit32u BVar1;
  uint uVar2;
  
  BVar1 = chip->cycles;
  uVar2 = ((BVar1 + 0x14) / 0x18) * -0x18 + BVar1 + 0x14;
  if (chip->pg_reset[uVar2] != '\0') {
    chip->pg_inc[uVar2] = 0;
  }
  uVar2 = (BVar1 + 0x13) % 0x18;
  chip->pg_phase[uVar2] = chip->pg_phase[uVar2] + chip->pg_inc[uVar2] & 0xfffff;
  if ((chip->pg_reset[uVar2] != '\0') || (chip->mode_test_21[3] != '\0')) {
    chip->pg_phase[uVar2] = 0;
  }
  return;
}

Assistant:

void OPN2_PhaseGenerate(ym3438_t *chip)
{
    Bit32u slot;
    /* Mask increment */
    slot = (chip->cycles + 20) % 24;
    if (chip->pg_reset[slot])
    {
        chip->pg_inc[slot] = 0;
    }
    /* Phase step */
    slot = (chip->cycles + 19) % 24;
    chip->pg_phase[slot] += chip->pg_inc[slot];
    chip->pg_phase[slot] &= 0xfffff;
    if (chip->pg_reset[slot] || chip->mode_test_21[3])
    {
        chip->pg_phase[slot] = 0;
    }
}